

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PrintWithFallback<std::vector<unsigned_char,std::allocator<unsigned_char>>>
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *value,ostream *os)

{
  ostream *os_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *value_local;
  
  ContainerPrinter::PrintValue<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            (value,os);
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ProtobufPrinter, ConvertibleToIntegerPrinter,
      ConvertibleToStringViewPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}